

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::js::GeneratorOptions::ParseFromOptions
          (GeneratorOptions *this,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *options,string *error)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  char *pcVar5;
  bool bVar6;
  ulong uVar7;
  char *pcVar8;
  pointer ppVar9;
  GeneratorOptions *pGVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  GeneratorOptions *local_90;
  GeneratorOptions *local_88;
  GeneratorOptions *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string *local_38;
  
  ppVar9 = (options->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = error;
  if ((options->
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar9) {
    local_80 = (GeneratorOptions *)&this->extension;
    local_88 = (GeneratorOptions *)&this->library;
    local_90 = (GeneratorOptions *)&this->namespace_prefix;
    lVar11 = 0;
    uVar7 = 0;
    do {
      iVar1 = std::__cxx11::string::compare
                        ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
      ppVar9 = (options->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (iVar1 == 0) {
        iVar1 = std::__cxx11::string::compare
                          ((char *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar11));
        if (iVar1 != 0) {
          pcVar8 = (char *)local_38->_M_string_length;
          pcVar5 = "Unexpected option value for add_require_for_enums";
          goto LAB_00243c59;
        }
        this->add_require_for_enums = true;
      }
      else {
        iVar1 = std::__cxx11::string::compare
                          ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
        ppVar9 = (options->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (iVar1 == 0) {
          iVar1 = std::__cxx11::string::compare
                            ((char *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar11));
          if (iVar1 != 0) {
            pcVar8 = (char *)local_38->_M_string_length;
            pcVar5 = "Unexpected option value for binary";
            goto LAB_00243c59;
          }
          this->binary = true;
        }
        else {
          iVar1 = std::__cxx11::string::compare
                            ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
          ppVar9 = (options->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (iVar1 == 0) {
            iVar1 = std::__cxx11::string::compare
                              ((char *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar11));
            if (iVar1 != 0) {
              pcVar8 = (char *)local_38->_M_string_length;
              pcVar5 = "Unexpected option value for testonly";
              goto LAB_00243c59;
            }
            this->testonly = true;
          }
          else {
            iVar1 = std::__cxx11::string::compare
                              ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
            ppVar9 = (options->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (iVar1 == 0) {
              iVar1 = std::__cxx11::string::compare
                                ((char *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar11));
              if (iVar1 != 0) {
                pcVar8 = (char *)local_38->_M_string_length;
                pcVar5 = "Unexpected option value for error_on_name_conflict";
                goto LAB_00243c59;
              }
              this->error_on_name_conflict = true;
            }
            else {
              iVar1 = std::__cxx11::string::compare
                                ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11));
              pGVar10 = this;
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare
                                  ((char *)((long)&(((options->
                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                pGVar10 = local_90;
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare
                                    ((char *)((long)&(((options->
                                                                                                              
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                  pGVar10 = local_88;
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare
                                      ((char *)((long)&(((options->
                                                                                                                  
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                    ppVar9 = (options->
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    if (iVar1 == 0) {
                      iVar1 = std::__cxx11::string::compare
                                        ((char *)((long)&(ppVar9->second)._M_dataplus._M_p + lVar11)
                                        );
                      if (iVar1 == 0) {
                        this->import_style = kImportClosure;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare
                                          ((char *)((long)&(((options->
                                                                                                                          
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                        if (iVar1 == 0) {
                          this->import_style = kImportCommonJs;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare
                                            ((char *)((long)&(((options->
                                                                                                                              
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                          if (iVar1 == 0) {
                            this->import_style = kImportCommonJsStrict;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare
                                              ((char *)((long)&(((options->
                                                                                                                                  
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                            if (iVar1 == 0) {
                              this->import_style = kImportBrowser;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare
                                                ((char *)((long)&(((options->
                                                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                              if (iVar1 == 0) {
                                this->import_style = kImportEs6;
                              }
                              else {
                                std::operator+(&local_b0,"Unknown import style ",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)((long)&(((options->
                                                                                                                        
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  second)._M_dataplus._M_p + lVar11));
                                plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
                                local_58 = &local_48;
                                plVar3 = plVar2 + 2;
                                if ((long *)*plVar2 == plVar3) {
                                  local_48 = *plVar3;
                                  lStack_40 = plVar2[3];
                                }
                                else {
                                  local_48 = *plVar3;
                                  local_58 = (long *)*plVar2;
                                }
                                local_50 = plVar2[1];
                                *plVar2 = (long)plVar3;
                                plVar2[1] = 0;
                                *(undefined1 *)(plVar2 + 2) = 0;
                                plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
                                local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                                psVar4 = (size_type *)(plVar2 + 2);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)*plVar2 ==
                                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)psVar4) {
                                  local_78.field_2._M_allocated_capacity = *psVar4;
                                  local_78.field_2._8_8_ = plVar2[3];
                                }
                                else {
                                  local_78.field_2._M_allocated_capacity = *psVar4;
                                  local_78._M_dataplus._M_p = (pointer)*plVar2;
                                }
                                local_78._M_string_length = plVar2[1];
                                *plVar2 = (long)psVar4;
                                plVar2[1] = 0;
                                *(undefined1 *)(plVar2 + 2) = 0;
                                std::__cxx11::string::operator=
                                          ((string *)local_38,(string *)&local_78);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                  operator_delete(local_78._M_dataplus._M_p);
                                }
                                if (local_58 != &local_48) {
                                  operator_delete(local_58);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                                  operator_delete(local_b0._M_dataplus._M_p);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare
                                        ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11))
                      ;
                      pGVar10 = local_80;
                      if (iVar1 == 0) goto LAB_00243a49;
                      iVar1 = std::__cxx11::string::compare
                                        ((char *)((long)&(((options->
                                                                                                                      
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                      ppVar9 = (options->
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      if (iVar1 == 0) {
                        if (*(long *)((long)&(ppVar9->second)._M_string_length + lVar11) != 0) {
                          pcVar8 = "Unexpected option value for one_output_file_per_input_file";
LAB_00243cbc:
                          std::__cxx11::string::operator=((string *)local_38,pcVar8);
                          return false;
                        }
                        this->one_output_file_per_input_file = true;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare
                                          ((char *)((long)&(ppVar9->first)._M_dataplus._M_p + lVar11
                                                   ));
                        ppVar9 = (options->
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        if (iVar1 != 0) {
                          iVar1 = std::__cxx11::string::compare
                                            ((char *)((long)&(ppVar9->second)._M_dataplus._M_p +
                                                     lVar11));
                          pGVar10 = this;
                          if (iVar1 != 0) {
                            std::operator+(&local_78,"Unknown option: ",
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)((long)&(((options->
                                                                                                                
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->first
                                                  )._M_dataplus._M_p + lVar11));
                            std::__cxx11::string::operator=((string *)local_38,(string *)&local_78);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_78._M_dataplus._M_p == &local_78.field_2) {
                              return false;
                            }
                            operator_delete(local_78._M_dataplus._M_p);
                            return false;
                          }
                          goto LAB_00243a49;
                        }
                        if (*(long *)((long)&(ppVar9->second)._M_string_length + lVar11) != 0) {
                          pcVar8 = "Unexpected option value for annotate_code";
                          goto LAB_00243cbc;
                        }
                        this->annotate_code = true;
                      }
                    }
                    goto LAB_00243a4e;
                  }
                }
              }
LAB_00243a49:
              std::__cxx11::string::_M_assign((string *)pGVar10);
            }
          }
        }
      }
LAB_00243a4e:
      uVar7 = uVar7 + 1;
      ppVar9 = (options->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x40;
    } while (uVar7 < (ulong)((long)(options->
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9 >> 6))
    ;
  }
  bVar6 = true;
  if ((this->import_style != kImportClosure) &&
     ((((this->add_require_for_enums != false || (this->testonly != false)) ||
       ((this->library)._M_string_length != 0)) ||
      (((this->error_on_name_conflict != false ||
        (iVar1 = std::__cxx11::string::compare((char *)&this->extension), iVar1 != 0)) ||
       (this->one_output_file_per_input_file == true)))))) {
    pcVar8 = (char *)local_38->_M_string_length;
    pcVar5 = 
    "The add_require_for_enums, testonly, library, error_on_name_conflict, extension, and one_output_file_per_input_file options should only be used for import_style=closure"
    ;
LAB_00243c59:
    bVar6 = false;
    std::__cxx11::string::_M_replace((ulong)local_38,0,pcVar8,(ulong)pcVar5);
  }
  return bVar6;
}

Assistant:

bool GeneratorOptions::ParseFromOptions(
    const std::vector<std::pair<std::string, std::string> >& options,
    std::string* error) {
  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "add_require_for_enums") {
      if (options[i].second != "") {
        *error = "Unexpected option value for add_require_for_enums";
        return false;
      }
      add_require_for_enums = true;
    } else if (options[i].first == "binary") {
      if (options[i].second != "") {
        *error = "Unexpected option value for binary";
        return false;
      }
      binary = true;
    } else if (options[i].first == "testonly") {
      if (options[i].second != "") {
        *error = "Unexpected option value for testonly";
        return false;
      }
      testonly = true;
    } else if (options[i].first == "error_on_name_conflict") {
      if (options[i].second != "") {
        *error = "Unexpected option value for error_on_name_conflict";
        return false;
      }
      error_on_name_conflict = true;
    } else if (options[i].first == "output_dir") {
      output_dir = options[i].second;
    } else if (options[i].first == "namespace_prefix") {
      namespace_prefix = options[i].second;
    } else if (options[i].first == "library") {
      library = options[i].second;
    } else if (options[i].first == "import_style") {
      if (options[i].second == "closure") {
        import_style = kImportClosure;
      } else if (options[i].second == "commonjs") {
        import_style = kImportCommonJs;
      } else if (options[i].second == "commonjs_strict") {
        import_style = kImportCommonJsStrict;
      } else if (options[i].second == "browser") {
        import_style = kImportBrowser;
      } else if (options[i].second == "es6") {
        import_style = kImportEs6;
      } else {
        *error = "Unknown import style " + options[i].second + ", expected " +
                 "one of: closure, commonjs, browser, es6.";
      }
    } else if (options[i].first == "extension") {
      extension = options[i].second;
    } else if (options[i].first == "one_output_file_per_input_file") {
      if (!options[i].second.empty()) {
        *error = "Unexpected option value for one_output_file_per_input_file";
        return false;
      }
      one_output_file_per_input_file = true;
    } else if (options[i].first == "annotate_code") {
      if (!options[i].second.empty()) {
        *error = "Unexpected option value for annotate_code";
        return false;
      }
      annotate_code = true;
    } else {
      // Assume any other option is an output directory, as long as it is a bare
      // `key` rather than a `key=value` option.
      if (options[i].second != "") {
        *error = "Unknown option: " + options[i].first;
        return false;
      }
      output_dir = options[i].first;
    }
  }

  if (import_style != kImportClosure &&
      (add_require_for_enums || testonly || !library.empty() ||
       error_on_name_conflict || extension != ".js" ||
       one_output_file_per_input_file)) {
    *error =
        "The add_require_for_enums, testonly, library, error_on_name_conflict, "
        "extension, and one_output_file_per_input_file options should only be "
        "used for import_style=closure";
    return false;
  }

  return true;
}